

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_fwd.hpp
# Opt level: O0

void __thiscall toml::detail::region::region(region *this,region *param_2)

{
  long in_RSI;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc8;
  
  std::shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::shared_ptr
            (in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  memcpy(in_RDI + 3,(void *)(in_RSI + 0x30),0x38);
  return;
}

Assistant:

region(const region&) = default;